

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_6::TwoLevelIterator::status(TwoLevelIterator *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  long in_FS_OFFSET;
  bool bVar2;
  Iterator *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  IteratorWrapper::status((IteratorWrapper *)&local_40);
  if (local_40 == (Iterator *)0x0) {
    if (*(long *)(in_RSI + 0x70) == 0) {
      bVar2 = false;
    }
    else {
      IteratorWrapper::status((IteratorWrapper *)&local_40);
      bVar2 = local_40 != (Iterator *)0x0;
      if (local_40 != (Iterator *)0x0) {
        operator_delete__(local_40);
      }
    }
    if (!bVar2) {
      if (*(char **)(in_RSI + 0x48) == (char *)0x0) {
        pp_Var1 = (_func_int **)0x0;
      }
      else {
        pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x48));
      }
      (this->super_Iterator)._vptr_Iterator = pp_Var1;
      goto LAB_00660986;
    }
  }
  else {
    operator_delete__(local_40);
  }
  IteratorWrapper::status((IteratorWrapper *)this);
LAB_00660986:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }